

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

bool __thiscall SQInstance::Set(SQInstance *this,SQObjectPtr *key,SQObjectPtr *val)

{
  bool bVar1;
  undefined1 local_38 [8];
  SQObjectPtr idx;
  SQObjectPtr *val_local;
  SQObjectPtr *key_local;
  SQInstance *this_local;
  
  idx.super_SQObject._unVal = (SQObjectValue)val;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
  bVar1 = SQTable::Get(this->_class->_members,key,(SQObjectPtr *)local_38);
  if ((bVar1) && ((idx.super_SQObject._type & 0x2000000) != 0)) {
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)
               ((long)&this->_values[0].super_SQObject._type +
               (ulong)((idx.super_SQObject._type & 0xffffff) << 4)),
               (SQObjectPtr *)idx.super_SQObject._unVal.pTable);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
  return this_local._7_1_;
}

Assistant:

bool Set(const SQObjectPtr &key,const SQObjectPtr &val) {
        SQObjectPtr idx;
        if(_class->_members->Get(key,idx) && _isfield(idx)) {
            _values[_member_idx(idx)] = val;
            return true;
        }
        return false;
    }